

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O3

Vec_Ptr_t * Amap_DeriveTokens(char *pBuffer)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  char *__s1;
  ulong uVar4;
  int iVar5;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  __s1 = strtok(pBuffer," =\t\r\n");
  if (__s1 != (char *)0x0) {
    iVar5 = 1000;
    uVar4 = 0;
    while( true ) {
      if (iVar5 == (int)uVar4) {
        ppvVar3 = pVVar2->pArray;
        if (uVar4 < 0x10) {
          if (ppvVar3 == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(ppvVar3,0x80);
          }
          pVVar2->pArray = ppvVar3;
          iVar5 = 0x10;
        }
        else {
          if (ppvVar3 == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar4 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(ppvVar3,uVar4 << 4);
          }
          pVVar2->pArray = ppvVar3;
          iVar5 = (int)uVar4 * 2;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      ppvVar3[uVar4] = __s1;
      uVar4 = uVar4 + 1;
      __s1 = strtok((char *)0x0," =\t\r\n");
      if (__s1 == (char *)0x0) break;
      iVar1 = strcmp(__s1,"LATCH");
      if (iVar1 == 0) {
        while (iVar1 = strcmp(__s1,"GATE"), iVar1 != 0) {
          __s1 = strtok((char *)0x0," =\t\r\n");
          if (__s1 == (char *)0x0) goto LAB_003cb330;
        }
      }
    }
LAB_003cb330:
    pVVar2->nSize = (int)uVar4;
    pVVar2->nCap = iVar5;
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Amap_DeriveTokens( char * pBuffer )
{
    Vec_Ptr_t * vTokens;
    char * pToken;
    vTokens = Vec_PtrAlloc( 1000 );
    pToken = strtok( pBuffer, " =\t\r\n" );
    while ( pToken )
    {
        Vec_PtrPush( vTokens, pToken );
        pToken = strtok( NULL, " =\t\r\n" );
        // skip latches
        if ( pToken && strcmp( pToken, "LATCH" ) == 0 )
            while ( pToken && strcmp( pToken, "GATE" ) != 0 )
                pToken = strtok( NULL, " =\t\r\n" );
    }
    return vTokens;
}